

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-wizard.c
# Opt level: O0

void wiz_hack_map_query_feature(chunk *c,void *closure,loc_conflict grid,_Bool *show,uint8_t *color)

{
  _Bool _Var1;
  uint8_t uVar2;
  square_conflict *psVar3;
  int local_3c;
  wchar_t sq_feat;
  wchar_t i;
  wiz_query_feature_closure *sel_feats;
  uint8_t *color_local;
  _Bool *show_local;
  void *closure_local;
  chunk *c_local;
  loc_conflict grid_local;
  
  local_3c = 0;
  psVar3 = square(c,grid);
  while( true ) {
    if (*(int *)((long)closure + 8) <= local_3c) {
      *show = false;
      return;
    }
    if ((uint)psVar3->feat == *(uint *)(*closure + (long)local_3c * 4)) break;
    local_3c = local_3c + 1;
  }
  *show = true;
  _Var1 = square_ispassable(c,grid);
  uVar2 = '\x04';
  if (_Var1) {
    uVar2 = '\v';
  }
  *color = uVar2;
  return;
}

Assistant:

static void wiz_hack_map_query_feature(struct chunk *c, void *closure,
	struct loc grid, bool *show, uint8_t *color)
{
	const struct wiz_query_feature_closure *sel_feats = closure;
	int i = 0;
	int sq_feat = square(c, grid)->feat;

	while (1) {
		if (i >= sel_feats->n) {
			*show = false;
			return;
		}
		if (sq_feat == sel_feats->features[i]) {
			*show = true;
			*color = (square_ispassable(c, grid)) ?
				COLOUR_YELLOW : COLOUR_RED;
			return;
		}
		++i;
	}
}